

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64instapi.cpp
# Opt level: O1

Error asmjit::v1_14::a64::InstInternal::queryRWInfo
                (BaseInst *inst,Operand_ *operands,size_t opCount,InstRWInfo *out)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  byte *pbVar5;
  uint32_t uVar6;
  OpRWInfo *pOVar7;
  ulong uVar8;
  Operand_ *pOVar9;
  OpRWFlags OVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar2 = *(ushort *)inst;
  if (0x2fc < uVar2) {
    return 0x1a;
  }
  out->_instFlags = kNone;
  out->_readFlags = kNone;
  out->_opCount = (uint8_t)opCount;
  out->_rmFeature = '\0';
  (out->_extraReg)._opFlags = kNone;
  (out->_extraReg)._physId = '\0';
  (out->_extraReg)._rmSize = '\0';
  (out->_extraReg)._consecutiveLeadCount = '\0';
  (out->_extraReg)._reserved[0] = '\0';
  (out->_extraReg)._readByteMask = 0;
  (out->_extraReg)._writeByteMask = 0;
  (out->_extraReg)._extendByteMask = 0;
  out->_writeFlags = kNone;
  uVar3 = *(ushort *)(&DAT_00154404 + (ulong)uVar2 * 8);
  if ((opCount < 3) || ((*(ushort *)(&DAT_00154406 + (ulong)uVar2 * 8) & 0x80) == 0)) {
    if (opCount != 0) {
      uVar11 = 0;
      uVar8 = 1;
      do {
        pOVar7 = out->_operands + uVar11;
        if ((operands[uVar11]._signature._bits & 7) - 1 < 2) {
          pOVar9 = operands + uVar11;
          bVar1 = instRWInfoData[uVar11 + (ulong)uVar3 * 6];
          OVar10 = bVar1 & ~kZExt;
          pOVar7->_opFlags = OVar10;
          pOVar7->_physId = 0xff;
          pOVar7->_rmSize = '\0';
          pOVar7->_consecutiveLeadCount = '\0';
          pOVar7->_reserved[0] = '\0';
          uVar13 = -(ulong)(bVar1 & kRead);
          uVar11 = (ulong)((int)((uint)bVar1 << 0x1e) >> 0x1f);
          pOVar7->_readByteMask = uVar13;
          pOVar7->_writeByteMask = uVar11;
          pOVar7->_extendByteMask = 0;
          uVar4 = (pOVar9->_signature)._bits;
          if ((uVar4 & 7) == 1) {
            if ((short)uVar4 < 0) {
              bVar1 = *(byte *)((long)&elementTypeSize + (ulong)(uVar4 >> 0xc & 7));
              uVar12 = (ulong)~(uint)(-1L << (bVar1 & 0x3f)) <<
                       (((byte)(uVar4 >> 0x10) & 0xf) * bVar1 & 0x3f);
              pOVar7->_readByteMask = uVar13 & uVar12;
              pOVar7->_writeByteMask = uVar12 & uVar11;
            }
          }
          else {
            if ((uVar4 & 0xf8) != 0) {
              pOVar7->_opFlags = OVar10 + kMemBaseRead;
              if ((uVar4 & 0x1f00) == 0) {
                uVar6 = 0;
                if ((uVar4 & 0xf8) == 0) {
                  uVar6 = pOVar9->_baseId;
                }
                if (((uVar4 & 0x3000000) != 0) && (uVar6 != 0 || pOVar9->_data[1] != 0))
                goto LAB_00113594;
              }
              else if ((uVar4 & 0x3000000) != 0) {
LAB_00113594:
                pOVar7->_opFlags = OVar10 | kMemBaseRW;
              }
            }
            if ((uVar4 & 0x1f00) != 0) {
              pbVar5 = (byte *)((long)&pOVar7->_opFlags + 1);
              *pbVar5 = *pbVar5 | 0x40;
            }
          }
        }
        else {
          pOVar7->_writeByteMask = 0;
          pOVar7->_extendByteMask = 0;
          pOVar7->_opFlags = kNone;
          pOVar7->_physId = '\0';
          pOVar7->_rmSize = '\0';
          pOVar7->_consecutiveLeadCount = '\0';
          pOVar7->_reserved[0] = '\0';
          pOVar7->_readByteMask = 0;
        }
        bVar14 = uVar8 < opCount;
        uVar11 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar14);
    }
  }
  else {
    uVar11 = 1;
    uVar8 = 0;
    do {
      uVar13 = uVar11;
      pOVar7 = out->_operands + uVar8;
      if ((operands[uVar8]._signature._bits & 7) - 1 < 2) {
        pOVar9 = operands + uVar8;
        bVar1 = *(byte *)(((ulong)uVar3 * 6 + 0x154391) - (ulong)(uVar8 < opCount - 1));
        OVar10 = bVar1 & ~kZExt;
        pOVar7->_opFlags = OVar10;
        pOVar7->_physId = 0xff;
        pOVar7->_rmSize = '\0';
        pOVar7->_consecutiveLeadCount = '\0';
        pOVar7->_reserved[0] = '\0';
        pOVar7->_readByteMask = -(ulong)(bVar1 & kRead);
        pOVar7->_writeByteMask = (long)((int)((uint)bVar1 << 0x1e) >> 0x1f);
        pOVar7->_extendByteMask = 0;
        uVar4 = (pOVar9->_signature)._bits;
        if ((uVar4 & 7) == 1) {
          if ((int)uVar13 == 1) {
            pOVar7->_consecutiveLeadCount = (uint8_t)(opCount - 1);
          }
          else {
            pOVar7->_opFlags = OVar10 | kConsecutive;
          }
        }
        else {
          if ((uVar4 & 0xf8) != 0) {
            pOVar7->_opFlags = OVar10 + kMemBaseRead;
            if ((uVar4 & 0x1f00) == 0) {
              uVar6 = 0;
              if ((uVar4 & 0xf8) == 0) {
                uVar6 = pOVar9->_baseId;
              }
              if (((uVar4 & 0x3000000) != 0) && (uVar6 != 0 || pOVar9->_data[1] != 0))
              goto LAB_00113460;
            }
            else if ((uVar4 & 0x3000000) != 0) {
LAB_00113460:
              pOVar7->_opFlags = OVar10 | kMemBaseRW;
            }
          }
          if ((uVar4 & 0x1f00) != 0) {
            pbVar5 = (byte *)((long)&pOVar7->_opFlags + 1);
            *pbVar5 = *pbVar5 | 0x40;
          }
        }
      }
      else {
        pOVar7->_writeByteMask = 0;
        pOVar7->_extendByteMask = 0;
        pOVar7->_opFlags = kNone;
        pOVar7->_physId = '\0';
        pOVar7->_rmSize = '\0';
        pOVar7->_consecutiveLeadCount = '\0';
        pOVar7->_reserved[0] = '\0';
        pOVar7->_readByteMask = 0;
      }
      uVar11 = (ulong)((int)uVar13 + 1);
      uVar8 = uVar13;
    } while (uVar13 < opCount);
  }
  return 0;
}

Assistant:

Error queryRWInfo(const BaseInst& inst, const Operand_* operands, size_t opCount, InstRWInfo* out) noexcept {
  // Get the instruction data.
  uint32_t realId = inst.id() & uint32_t(InstIdParts::kRealId);

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(realId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  out->_instFlags = InstRWFlags::kNone;
  out->_opCount = uint8_t(opCount);
  out->_rmFeature = 0;
  out->_extraReg.reset();
  out->_readFlags = CpuRWFlags::kNone; // TODO: [ARM] Read PSTATUS.
  out->_writeFlags = CpuRWFlags::kNone; // TODO: [ARM] Write PSTATUS

  const InstDB::InstInfo& instInfo = InstDB::_instInfoTable[realId];
  const InstRWInfoData& rwInfo = instRWInfoData[instInfo.rwInfoIndex()];

  if (instInfo.hasFlag(InstDB::kInstFlagConsecutive) && opCount > 2) {
    for (uint32_t i = 0; i < opCount; i++) {
      OpRWInfo& op = out->_operands[i];
      const Operand_& srcOp = operands[i];

      if (!srcOp.isRegOrMem()) {
        op.reset();
        continue;
      }

      OpRWFlags rwFlags = i < opCount - 1 ? (OpRWFlags)rwInfo.rwx[0] : (OpRWFlags)rwInfo.rwx[1];

      op._opFlags = rwFlags & ~(OpRWFlags::kZExt);
      op._physId = BaseReg::kIdBad;
      op._rmSize = 0;
      op._resetReserved();

      uint64_t rByteMask = op.isRead() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;
      uint64_t wByteMask = op.isWrite() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;

      op._readByteMask = rByteMask;
      op._writeByteMask = wByteMask;
      op._extendByteMask = 0;
      op._consecutiveLeadCount = 0;

      if (srcOp.isReg()) {
        if (i == 0)
          op._consecutiveLeadCount = uint8_t(opCount - 1);
        else
          op.addOpFlags(OpRWFlags::kConsecutive);
      }
      else {
        const Mem& memOp = srcOp.as<Mem>();

        if (memOp.hasBase()) {
          op.addOpFlags(OpRWFlags::kMemBaseRead);
          if ((memOp.hasIndex() || memOp.hasOffset()) && memOp.isPreOrPost()) {
            op.addOpFlags(OpRWFlags::kMemBaseWrite);
          }
        }

        if (memOp.hasIndex()) {
          op.addOpFlags(OpRWFlags::kMemIndexRead);
        }
      }
    }
  }
  else {
    for (uint32_t i = 0; i < opCount; i++) {
      OpRWInfo& op = out->_operands[i];
      const Operand_& srcOp = operands[i];

      if (!srcOp.isRegOrMem()) {
        op.reset();
        continue;
      }

      OpRWFlags rwFlags = (OpRWFlags)rwInfo.rwx[i];

      op._opFlags = rwFlags & ~(OpRWFlags::kZExt);
      op._physId = BaseReg::kIdBad;
      op._rmSize = 0;
      op._resetReserved();

      uint64_t rByteMask = op.isRead() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;
      uint64_t wByteMask = op.isWrite() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;

      op._readByteMask = rByteMask;
      op._writeByteMask = wByteMask;
      op._extendByteMask = 0;
      op._consecutiveLeadCount = 0;

      if (srcOp.isReg()) {
        if (srcOp.as<Vec>().hasElementIndex()) {
          // Only part of the vector is accessed if element index [] is used.
          VecElementType elementType = srcOp.as<Vec>().elementType();
          uint32_t elementIndex = srcOp.as<Vec>().elementIndex();

          uint32_t elementSize = elementTypeSize[size_t(elementType)];
          uint64_t accessMask = uint64_t(Support::lsbMask<uint32_t>(elementSize)) << (elementIndex * elementSize);

          op._readByteMask &= accessMask;
          op._writeByteMask &= accessMask;
        }

        // TODO: [ARM] RW info is not finished.
      }
      else {
        const Mem& memOp = srcOp.as<Mem>();

        if (memOp.hasBase()) {
          op.addOpFlags(OpRWFlags::kMemBaseRead);
          if ((memOp.hasIndex() || memOp.hasOffset()) && memOp.isPreOrPost()) {
            op.addOpFlags(OpRWFlags::kMemBaseWrite);
          }
        }

        if (memOp.hasIndex()) {
          op.addOpFlags(OpRWFlags::kMemIndexRead);
        }
      }
    }
  }

  return kErrorOk;
}